

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_errors.cc
# Opt level: O0

void __thiscall bssl::CertErrors::AddWarning(CertErrors *this,CertErrorId id)

{
  unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_> local_20;
  CertErrorId local_18;
  CertErrorId id_local;
  CertErrors *this_local;
  
  local_18 = id;
  id_local = this;
  ::std::unique_ptr<bssl::CertErrorParams,std::default_delete<bssl::CertErrorParams>>::
  unique_ptr<std::default_delete<bssl::CertErrorParams>,void>
            ((unique_ptr<bssl::CertErrorParams,std::default_delete<bssl::CertErrorParams>> *)
             &local_20,(nullptr_t)0x0);
  AddWarning(this,id,&local_20);
  ::std::unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_>::~unique_ptr
            (&local_20);
  return;
}

Assistant:

void CertErrors::AddWarning(CertErrorId id) { AddWarning(id, nullptr); }